

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O2

png_bytep png_read_buffer(png_structrp png_ptr,png_alloc_size_t new_size,int warn)

{
  png_bytep ppVar1;
  
  ppVar1 = png_ptr->read_buffer;
  if (ppVar1 != (png_bytep)0x0) {
    if (new_size <= png_ptr->read_buffer_size) {
      return ppVar1;
    }
    png_ptr->read_buffer = (png_bytep)0x0;
    png_ptr->read_buffer_size = 0;
    png_free(png_ptr,ppVar1);
  }
  ppVar1 = (png_bytep)png_malloc_base(png_ptr,new_size);
  if (ppVar1 == (png_bytep)0x0) {
    if (warn < 2) {
      if (warn == 0) {
        png_chunk_error(png_ptr,"insufficient memory to read chunk");
      }
      png_chunk_warning(png_ptr,"insufficient memory to read chunk");
    }
    ppVar1 = (png_bytep)0x0;
  }
  else {
    png_ptr->read_buffer = ppVar1;
    png_ptr->read_buffer_size = new_size;
  }
  return ppVar1;
}

Assistant:

static png_bytep
png_read_buffer(png_structrp png_ptr, png_alloc_size_t new_size, int warn)
{
   png_bytep buffer = png_ptr->read_buffer;

   if (buffer != NULL && new_size > png_ptr->read_buffer_size)
   {
      png_ptr->read_buffer = NULL;
      png_ptr->read_buffer = NULL;
      png_ptr->read_buffer_size = 0;
      png_free(png_ptr, buffer);
      buffer = NULL;
   }

   if (buffer == NULL)
   {
      buffer = png_voidcast(png_bytep, png_malloc_base(png_ptr, new_size));

      if (buffer != NULL)
      {
         png_ptr->read_buffer = buffer;
         png_ptr->read_buffer_size = new_size;
      }

      else if (warn < 2) /* else silent */
      {
         if (warn != 0)
             png_chunk_warning(png_ptr, "insufficient memory to read chunk");

         else
             png_chunk_error(png_ptr, "insufficient memory to read chunk");
      }
   }

   return buffer;
}